

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O3

void __thiscall amrex::MLEBTensorOp::prepareForSolve(MLEBTensorOp *this)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  pointer paVar4;
  pointer paVar5;
  long lVar6;
  bool bVar7;
  byte bVar8;
  pointer pVVar9;
  pointer pVVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  pointer pMVar16;
  pointer pVVar17;
  int idim;
  long lVar18;
  long lVar19;
  Array<const_MultiFab_*,_3> local_78;
  ulong local_60;
  IntVect local_54;
  Array<MultiFab_*,_3> local_48;
  
  bVar8 = (this->super_MLEBABecLap).field_0x3d5;
  if (bVar8 != (this->super_MLEBABecLap).field_0x3d6) {
    Assert_host("m_has_kappa == m_has_eb_kappa",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLEBTensorOp.cpp"
                ,0x8f,
                "\"MLEBTensorOp: must call both setBulkViscosity and setEBBulkViscosity or none.\"")
    ;
    bVar8 = (this->super_MLEBABecLap).field_0x3d5;
  }
  uVar3 = (this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
          m_num_amr_levels;
  uVar14 = (ulong)uVar3;
  if ((bVar8 & 1) == 0) {
    if (0 < (int)uVar3) {
      pVVar9 = (this->m_kappa).
               super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar19 = 0;
      do {
        paVar4 = *(pointer *)
                  ((long)&pVVar9[lVar19].
                          super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                          .
                          super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                  + 8);
        paVar5 = *(pointer *)
                  &pVVar9[lVar19].
                   super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                   .
                   super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ;
        if (paVar4 != paVar5 && -1 < (long)paVar4 - (long)paVar5) {
          lVar18 = 0xc0;
          lVar12 = 0;
          do {
            lVar11 = 3;
            lVar15 = lVar18;
            do {
              lVar6 = *(long *)&(this->m_kappa).
                                super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar19].
                                super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              ;
              lVar2 = lVar6 + lVar15;
              FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                        ((FabArray<amrex::FArrayBox> *)(lVar2 + -0xc0),0.0,0,*(int *)(lVar2 + 0xc),
                         (IntVect *)(lVar6 + lVar15));
              lVar15 = lVar15 + 0x180;
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
            lVar12 = lVar12 + 1;
            pVVar9 = (this->m_kappa).
                     super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar15 = ((long)*(pointer *)
                             ((long)&pVVar9[lVar19].
                                     super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                     .
                                     super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                             + 8) -
                      *(long *)&pVVar9[lVar19].
                                super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                     >> 7) * -0x71c71c71c71c71c7;
            lVar18 = lVar18 + 0x480;
          } while (lVar15 - lVar12 != 0 && lVar12 <= lVar15);
          uVar14 = (ulong)(uint)(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.
                                super_MLLinOp.m_num_amr_levels;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < (int)uVar14);
    }
  }
  else if (0 < (int)uVar3) {
    do {
      uVar1 = uVar14 - 1;
      pVVar9 = (this->m_kappa).
               super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar19 = *(long *)&pVVar9[uVar1].
                         super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                         .
                         super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
      ;
      local_60 = uVar1;
      if (0x480 < (long)*(pointer *)
                         ((long)&pVVar9[uVar1].
                                 super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                 .
                                 super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                         + 8) - lVar19) {
        pVVar17 = pVVar9 + uVar1;
        lVar12 = 1;
        lVar18 = 0x780;
        do {
          local_78._M_elems[0] = (MultiFab *)(lVar19 + lVar18 + -0x780);
          local_78._M_elems[1] = (MultiFab *)(lVar19 + -0x600 + lVar18);
          local_78._M_elems[2] = (MultiFab *)(lVar19 + -0x480 + lVar18);
          lVar19 = *(long *)&(pVVar17->
                             super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                             ).
                             super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
          ;
          local_48._M_elems[2] = (MultiFab *)(lVar19 + lVar18);
          local_48._M_elems[0] = (MultiFab *)(lVar19 + -0x300 + lVar18);
          local_48._M_elems[1] = (MultiFab *)(lVar19 + -0x180 + lVar18);
          local_54.vect[0] = 2;
          local_54.vect[1] = 2;
          local_54.vect[2] = 2;
          EB_average_down_faces(&local_78,&local_48,&local_54,0);
          lVar12 = lVar12 + 1;
          pVVar9 = (this->m_kappa).
                   super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pVVar17 = pVVar9 + uVar1;
          lVar19 = *(long *)&(pVVar17->
                             super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                             ).
                             super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
          ;
          lVar15 = ((long)*(pointer *)
                           ((long)&(pVVar17->
                                   super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                   ).
                                   super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                           + 8) - lVar19 >> 7) * -0x71c71c71c71c71c7;
          lVar18 = lVar18 + 0x480;
        } while (lVar15 - lVar12 != 0 && lVar12 <= lVar15);
      }
      if (uVar14 == 1) break;
      paVar4 = *(pointer *)
                ((long)&pVVar9[uVar1].
                        super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                        .
                        super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                + 8);
      local_78._M_elems[0] = paVar4[-1]._M_elems;
      local_78._M_elems[1] = paVar4[-1]._M_elems + 1;
      local_78._M_elems[2] = paVar4[-1]._M_elems + 2;
      local_48._M_elems[0] =
           *(MultiFab **)
            &pVVar9[uVar14 - 2].
             super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
             .
             super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
      ;
      local_48._M_elems[1] = local_48._M_elems[0] + 1;
      local_48._M_elems[2] = local_48._M_elems[0] + 2;
      local_54.vect[0] = 2;
      local_54.vect[1] = 2;
      local_54.vect[2] = 2;
      EB_average_down_faces
                (&local_78,&local_48,&local_54,
                 *(Geometry **)
                  &(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
                   m_geom.
                   super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar14 - 2].
                   super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>);
      bVar7 = 1 < (long)uVar14;
      uVar14 = local_60;
    } while (bVar7);
  }
  uVar3 = (this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
          m_num_amr_levels;
  uVar14 = (ulong)uVar3;
  if ((this->super_MLEBABecLap).field_0x3d6 == '\0') {
    if ((int)uVar3 < 1) goto LAB_006f9eea;
    pVVar10 = (this->m_eb_kappa).
              super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
              .
              super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar19 = 0;
    do {
      lVar12 = *(long *)&pVVar10[lVar19].
                         super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
      if (0 < (long)*(pointer *)
                     ((long)&pVVar10[lVar19].
                             super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                             super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> +
                     8) - lVar12) {
        lVar15 = 0xc0;
        lVar18 = 0;
        do {
          FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)(lVar12 + lVar15 + -0xc0),0.0,0,
                     *(int *)(lVar12 + lVar15 + 0xc),(IntVect *)(lVar12 + lVar15));
          lVar18 = lVar18 + 1;
          pVVar10 = (this->m_eb_kappa).
                    super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar12 = *(long *)&pVVar10[lVar19].
                             super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                             super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
          lVar11 = ((long)*(pointer *)
                           ((long)&pVVar10[lVar19].
                                   super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                                   super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                           + 8) - lVar12 >> 7) * -0x5555555555555555;
          lVar15 = lVar15 + 0x180;
        } while (lVar11 - lVar18 != 0 && lVar18 <= lVar11);
        uVar14 = (ulong)(uint)(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.
                              super_MLLinOp.m_num_amr_levels;
      }
      lVar19 = lVar19 + 1;
      iVar13 = (int)uVar14;
    } while (lVar19 < iVar13);
  }
  else {
    if ((int)uVar3 < 1) goto LAB_006f9eea;
    do {
      uVar1 = uVar14 - 1;
      pVVar10 = (this->m_eb_kappa).
                super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                .
                super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar19 = *(long *)&pVVar10[uVar1].
                         super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
      pMVar16 = *(pointer *)
                 ((long)&pVVar10[uVar1].
                         super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> + 8);
      local_60 = uVar1;
      if (0x180 < (long)pMVar16 - lVar19) {
        lVar18 = 1;
        lVar12 = 0x180;
        do {
          local_78._M_elems[0] = (MultiFab *)0x200000002;
          local_78._M_elems[1] = (MultiFab *)CONCAT44(local_78._M_elems[1]._4_4_,2);
          EB_average_down_boundaries
                    ((MultiFab *)(lVar19 + lVar12 + -0x180),(MultiFab *)(lVar19 + lVar12),
                     (IntVect *)&local_78,0);
          lVar18 = lVar18 + 1;
          pVVar10 = (this->m_eb_kappa).
                    super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar19 = *(long *)&pVVar10[uVar1].
                             super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                             super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
          pMVar16 = *(pointer *)
                     ((long)&pVVar10[uVar1].
                             super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                             super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> +
                     8);
          lVar15 = ((long)pMVar16 - lVar19 >> 7) * -0x5555555555555555;
          lVar12 = lVar12 + 0x180;
        } while (lVar15 - lVar18 != 0 && lVar18 <= lVar15);
      }
      if (uVar14 == 1) break;
      local_78._M_elems[0] = (MultiFab *)0x200000002;
      local_78._M_elems[1] = (MultiFab *)CONCAT44(local_78._M_elems[1]._4_4_,2);
      EB_average_down_boundaries
                (pMVar16 + -1,
                 *(MultiFab **)
                  &pVVar10[uVar14 - 2].
                   super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                   super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,
                 (IntVect *)&local_78,0);
      bVar7 = 1 < (long)uVar14;
      uVar14 = local_60;
    } while (bVar7);
    iVar13 = (this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
             m_num_amr_levels;
  }
  if (0 < iVar13) {
    lVar19 = 0;
    do {
      lVar12 = 0;
      lVar18 = 0;
      do {
        MultiFab::Xpay((MultiFab *)
                       (*(long *)&(this->super_MLEBABecLap).m_b_coeffs.
                                  super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar19].
                                  super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                  .
                                  super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                       + lVar12),1.3333333333333333,
                       (MultiFab *)
                       (*(long *)&(this->m_kappa).
                                  super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar19].
                                  super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                  .
                                  super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                       + lVar12),0,(int)lVar18,1,0);
        lVar18 = lVar18 + 1;
        lVar12 = lVar12 + 0x180;
      } while (lVar18 != 3);
      lVar19 = lVar19 + 1;
    } while (lVar19 < (this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
                      m_num_amr_levels);
  }
LAB_006f9eea:
  MLEBABecLap::prepareForSolve(&this->super_MLEBABecLap);
  return;
}

Assistant:

void
MLEBTensorOp::prepareForSolve ()
{
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(m_has_kappa == m_has_eb_kappa,
        "MLEBTensorOp: must call both setBulkViscosity and setEBBulkViscosity or none.");

    if (m_has_kappa) {
        for (int amrlev = NAMRLevels()-1; amrlev >= 0; --amrlev) {
            for (int mglev = 1; mglev < m_kappa[amrlev].size(); ++mglev) {
                amrex::EB_average_down_faces(GetArrOfConstPtrs(m_kappa[amrlev][mglev-1]),
                                             GetArrOfPtrs     (m_kappa[amrlev][mglev  ]),
                                             IntVect(mg_coarsen_ratio), 0);
            }
            if (amrlev > 0) {
                amrex::EB_average_down_faces(GetArrOfConstPtrs(m_kappa[amrlev  ].back()),
                                             GetArrOfPtrs     (m_kappa[amrlev-1].front()),
                                             IntVect(mg_coarsen_ratio), m_geom[amrlev-1][0]);
            }
        }
    } else {
        for (int amrlev = 0; amrlev < NAMRLevels(); ++amrlev) {
            for (int mglev = 0; mglev < m_kappa[amrlev].size(); ++mglev) {
                for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                    m_kappa[amrlev][mglev][idim].setVal(0.0);
                }
            }
        }
    }

    if (m_has_eb_kappa) {
        for (int amrlev = NAMRLevels()-1; amrlev >= 0; --amrlev) {
            for (int mglev = 1; mglev < m_eb_kappa[amrlev].size(); ++mglev) {
                amrex::EB_average_down_boundaries(m_eb_kappa[amrlev][mglev-1],
                                                  m_eb_kappa[amrlev][mglev  ],
                                                  IntVect(mg_coarsen_ratio), 0);
            }
            if (amrlev > 0) {
                amrex::EB_average_down_boundaries(m_eb_kappa[amrlev  ].back(),
                                                  m_eb_kappa[amrlev-1].front(),
                                                  IntVect(mg_coarsen_ratio), 0);
            }
        }
    } else {
        for (int amrlev = 0; amrlev < NAMRLevels(); ++amrlev) {
            for (int mglev = 0; mglev < m_eb_kappa[amrlev].size(); ++mglev) {
                m_eb_kappa[amrlev][mglev].setVal(0.0);
            }
        }
    }

    for (int amrlev = 0; amrlev < NAMRLevels(); ++amrlev) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            int icomp = idim;
            MultiFab::Xpay(m_b_coeffs[amrlev][0][idim], 4./3.,
                           m_kappa[amrlev][0][idim], 0, icomp, 1, 0);
        }
    }

    MLEBABecLap::prepareForSolve();
}